

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

bool __thiscall
cfd::ConfidentialTransactionContext::IsFindOutPoint
          (ConfidentialTransactionContext *this,
          vector<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_> *list,OutPoint *outpoint
          )

{
  OutPoint *pOVar1;
  OutPoint *pOVar2;
  bool bVar3;
  OutPoint *object;
  OutPoint *target;
  
  pOVar1 = (list->super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pOVar2 = (list->super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  do {
    object = pOVar2;
    if (object == pOVar1) break;
    bVar3 = core::OutPoint::operator==(outpoint,object);
    pOVar2 = object + 1;
  } while (!bVar3);
  return object != pOVar1;
}

Assistant:

bool ConfidentialTransactionContext::IsFindOutPoint(
    const std::vector<OutPoint>& list, const OutPoint& outpoint) const {
  for (const auto& target : list) {
    if (outpoint == target) return true;
  }
  return false;
}